

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O2

ion_err_t linear_hash_write_record
                    (ion_fpos_t record_loc,ion_byte_t *key,ion_byte_t *value,ion_byte_t *status,
                    linear_hash_table_t *linear_hash)

{
  FILE *__s;
  long lVar1;
  size_t __size;
  ion_err_t iVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sStack_40;
  undefined8 local_38;
  
  if ((FILE *)linear_hash->database == (FILE *)0x0) {
    iVar2 = '\n';
  }
  else {
    sStack_40 = 0x10bef7;
    iVar3 = fseek((FILE *)linear_hash->database,record_loc,0);
    iVar2 = '\r';
    if (iVar3 == 0) {
      local_38 = linear_hash->record_total_size;
      uVar4 = local_38 + 0xf & 0xfffffffffffffff0;
      lVar1 = -uVar4;
      *(ion_byte_t *)((long)&local_38 - uVar4) = *status;
      sVar5 = (size_t)(linear_hash->super).record.key_size;
      *(undefined8 *)((long)&sStack_40 + lVar1) = 0x10bf38;
      memcpy((void *)((long)&local_38 + lVar1 + 1),key,sVar5);
      iVar3 = (linear_hash->super).record.value_size;
      *(undefined8 *)((long)&sStack_40 + lVar1) = 0x10bf4b;
      memcpy((void *)((long)&local_38 + lVar1 + sVar5 + 1),value,(long)iVar3);
      __s = (FILE *)linear_hash->database;
      *(undefined8 *)((long)&sStack_40 + lVar1) = 1;
      __size = local_38;
      sVar5 = *(size_t *)((long)&sStack_40 + lVar1);
      *(undefined8 *)((long)&sStack_40 + lVar1) = 0x10bf5e;
      sVar5 = fwrite((void *)((long)&local_38 + lVar1),__size,sVar5,__s);
      *(undefined8 *)((long)&sStack_40 + lVar1) = 7;
      iVar2 = (ion_err_t)*(undefined8 *)((long)&sStack_40 + lVar1);
      if (sVar5 == 1) {
        iVar2 = '\0';
      }
    }
  }
  return iVar2;
}

Assistant:

ion_err_t
linear_hash_write_record(
	ion_fpos_t			record_loc,
	ion_byte_t			*key,
	ion_byte_t			*value,
	ion_byte_t			*status,
	linear_hash_table_t *linear_hash
) {
	/* check the file is open */
	if (!linear_hash->database) {
		return err_file_close_error;
	}

	/* seek to end of file to append new bucket */
	if (0 != fseek(linear_hash->database, record_loc, SEEK_SET)) {
		return err_file_bad_seek;
	}

	ion_byte_t *record = alloca(linear_hash->record_total_size);

	memcpy(record, status, sizeof(*status));
	memcpy(record + sizeof(*status), key, linear_hash->super.record.key_size);
	memcpy(record + linear_hash->super.record.key_size + sizeof(*status), value, linear_hash->super.record.value_size);

	if (1 != fwrite(record, linear_hash->record_total_size, 1, linear_hash->database)) {
		return err_file_write_error;
	}

	return err_ok;
}